

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O0

int __thiscall
TPZSparseBlockDiagonal<long_double>::Substitution
          (TPZSparseBlockDiagonal<long_double> *this,TPZFMatrix<long_double> *B)

{
  int iVar1;
  TPZBaseMatrix *in_RSI;
  long in_RDI;
  int result;
  TPZFNMatrix<1000,_long_double> BG;
  undefined4 in_stack_ffffffffffffc0b8;
  undefined4 in_stack_ffffffffffffc0bc;
  TPZFNMatrix<1000,_long_double> *in_stack_ffffffffffffc0c0;
  undefined1 local_3f38 [8];
  TPZFMatrix<long_double> *in_stack_ffffffffffffc0d0;
  TPZFMatrix<long_double> *in_stack_ffffffffffffc0d8;
  TPZSparseBlockDiagonal<long_double> *in_stack_ffffffffffffc0e0;
  TPZFMatrix<long_double> *in_stack_ffffffffffffc188;
  TPZBlockDiagonal<long_double> *in_stack_ffffffffffffc190;
  
  TPZVec<long>::NElements((TPZVec<long> *)(in_RDI + 0x80));
  TPZBaseMatrix::Cols(in_RSI);
  TPZFNMatrix<1000,_long_double>::TPZFNMatrix
            (in_stack_ffffffffffffc0c0,CONCAT44(in_stack_ffffffffffffc0bc,in_stack_ffffffffffffc0b8)
             ,(int64_t)local_3f38);
  Gather(in_stack_ffffffffffffc0e0,in_stack_ffffffffffffc0d8,in_stack_ffffffffffffc0d0);
  iVar1 = TPZBlockDiagonal<long_double>::Substitution
                    (in_stack_ffffffffffffc190,in_stack_ffffffffffffc188);
  (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0xf])();
  Scatter(in_stack_ffffffffffffc0e0,in_stack_ffffffffffffc0d8,in_stack_ffffffffffffc0d0);
  TPZFNMatrix<1000,_long_double>::~TPZFNMatrix((TPZFNMatrix<1000,_long_double> *)0x13ac219);
  return iVar1;
}

Assistant:

int TPZSparseBlockDiagonal<TVar>::Substitution(TPZFMatrix<TVar>* B) const
{
	TPZFNMatrix<1000,TVar > BG(fBlock.NElements(),B->Cols());
	Gather(*B,BG);
	int result = TPZBlockDiagonal<TVar>::Substitution(&BG);
	B->Zero();
	Scatter(BG,*B);
	return result;
	
}